

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O3

void __thiscall QOpenGLTexturePrivate::allocateImmutableStorage(QOpenGLTexturePrivate *this)

{
  QOpenGLTextureHelper *pQVar1;
  int iVar2;
  code *pcVar3;
  BindingTarget BVar4;
  Target TVar5;
  undefined8 uVar6;
  GLuint GVar7;
  long *plVar8;
  int iVar9;
  TextureFormat TVar10;
  int iVar11;
  uint uVar12;
  
  TVar5 = this->target;
  if ((int)TVar5 < 0x8c18) {
    if ((int)TVar5 < 0x806f) {
      if (TVar5 == Target1D) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2000) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        pcVar3 = (code *)pQVar1->TextureStorage1D;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x80);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        (*pcVar3)(plVar8,this->textureId,0xde0,this->bindingTarget,this->mipLevels,this->format,
                  this->dimensions[0]);
        goto LAB_001543ff;
      }
      if (TVar5 != Target2D) goto LAB_001543ff;
    }
    else {
      if (TVar5 == Target3D) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x10) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar7 = this->textureId;
        iVar9 = this->mipLevels;
        TVar10 = this->format;
        iVar2 = this->dimensions[0];
        iVar11 = this->dimensions[1];
        uVar12 = this->dimensions[2];
        pcVar3 = (code *)pQVar1->TextureStorage3D;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x60);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        uVar6 = 0x806f;
        goto LAB_001543f3;
      }
      if ((TVar5 != TargetRectangle) && (TVar5 != TargetCubeMap)) goto LAB_001543ff;
    }
    pQVar1 = this->texFuncs;
    BVar4 = this->bindingTarget;
    GVar7 = this->textureId;
    iVar9 = this->mipLevels;
    TVar10 = this->format;
    iVar2 = this->dimensions[0];
    iVar11 = this->dimensions[1];
    pcVar3 = (code *)pQVar1->TextureStorage2D;
    plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x70);
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
    }
LAB_0015439b:
    (*pcVar3)(plVar8,GVar7,TVar5,BVar4,iVar9,TVar10,iVar2,iVar11);
  }
  else {
    if ((int)TVar5 < 0x9009) {
      if (TVar5 == Target1DArray) {
        if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
              super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2008) != 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar7 = this->textureId;
        iVar9 = this->mipLevels;
        TVar10 = this->format;
        iVar2 = this->dimensions[0];
        iVar11 = this->layers;
        pcVar3 = (code *)pQVar1->TextureStorage2D;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x70);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        TVar5 = Target1DArray;
        goto LAB_0015439b;
      }
      if (TVar5 != Target2DArray) {
        if (TVar5 == TargetBuffer) {
          allocateImmutableStorage();
          return;
        }
        goto LAB_001543ff;
      }
      if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
           super_QFlagsStorage<QOpenGLTexture::Feature>.i & 8) == 0) {
        allocateImmutableStorage();
        return;
      }
      pQVar1 = this->texFuncs;
      BVar4 = this->bindingTarget;
      GVar7 = this->textureId;
      iVar9 = this->mipLevels;
      TVar10 = this->format;
      iVar2 = this->dimensions[0];
      iVar11 = this->dimensions[1];
      uVar12 = this->layers;
      pcVar3 = (code *)pQVar1->TextureStorage3D;
      plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x60);
      if (((ulong)pcVar3 & 1) != 0) {
        pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
      }
      uVar6 = 0x8c1a;
    }
    else {
      if (TVar5 == TargetCubeMapArray) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x80) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        pcVar3 = (code *)pQVar1->TextureStorage3D;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x60);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        (*pcVar3)(plVar8,this->textureId,0x9009,this->bindingTarget,this->mipLevels,this->format,
                  this->dimensions[0],this->dimensions[1],this->layers * 6);
        goto LAB_001543ff;
      }
      if (TVar5 == Target2DMultisample) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 2) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar7 = this->textureId;
        iVar9 = this->samples;
        TVar10 = this->format;
        iVar2 = this->dimensions[0];
        iVar11 = this->dimensions[1];
        pcVar3 = (code *)pQVar1->TextureStorage2DMultisample;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0xa0);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        uVar12 = (uint)this->fixedSamplePositions;
        uVar6 = 0x9100;
      }
      else {
        if (TVar5 != Target2DMultisampleArray) goto LAB_001543ff;
        if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
              super_QFlagsStorage<QOpenGLTexture::Feature>.i & 10) != 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar1 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar7 = this->textureId;
        iVar9 = this->samples;
        TVar10 = this->format;
        iVar2 = this->dimensions[0];
        iVar11 = this->dimensions[1];
        uVar12 = this->layers;
        pcVar3 = (code *)pQVar1->TextureStorage3DMultisample;
        plVar8 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x90);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar8 + -1);
        }
        uVar6 = 0x9102;
      }
    }
LAB_001543f3:
    (*pcVar3)(plVar8,GVar7,uVar6,BVar4,iVar9,TVar10,iVar2,iVar11,uVar12);
  }
LAB_001543ff:
  this->storageAllocated = true;
  return;
}

Assistant:

void QOpenGLTexturePrivate::allocateImmutableStorage()
{
    switch (target) {
    case QOpenGLTexture::TargetBuffer:
        // Buffer textures get their storage from an external OpenGL buffer
        qWarning("Buffer textures do not allocate storage");
        return;

    case QOpenGLTexture::Target1D:
        if (features.testFlag(QOpenGLTexture::Texture1D)) {
            texFuncs->glTextureStorage1D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0]);
        } else {
            qWarning("1D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target1DArray:
        if (features.testFlag(QOpenGLTexture::Texture1D)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], layers);
        } else {
            qWarning("1D array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetRectangle:
        texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                     dimensions[0], dimensions[1]);
        break;

    case QOpenGLTexture::Target2DArray:
        if (features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], layers);
        } else {
            qWarning("Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::TargetCubeMapArray:
        // Cubemap arrays must specify number of layer-faces (6 * layers) as depth parameter
        if (features.testFlag(QOpenGLTexture::TextureCubeMapArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], 6 * layers);
        } else {
            qWarning("Cubemap Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target3D:
        if (features.testFlag(QOpenGLTexture::Texture3D)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], dimensions[2]);
        } else {
            qWarning("3D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisample:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)) {
            texFuncs->glTextureStorage2DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1],
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisampleArray:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1], layers,
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample array textures are not supported");
            return;
        }
        break;
    }

    storageAllocated = true;
}